

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.h
# Opt level: O0

int h264_is_skip_mb_type(uint32_t mb_type)

{
  int local_c;
  uint32_t mb_type_local;
  
  if ((mb_type == 0x20) || (mb_type == 0x38)) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static inline int h264_is_skip_mb_type(uint32_t mb_type) {
	switch (mb_type) {
		case H264_MB_TYPE_P_SKIP:
		case H264_MB_TYPE_B_SKIP:
			return 1;
		default:
			return 0;
	}
}